

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_transcode.cpp
# Opt level: O1

int __thiscall
ktx::CommandTranscode::OptionsTranscode::init(OptionsTranscode *this,EVP_PKEY_CTX *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined4 uVar3;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  int extraout_EAX_04;
  int extraout_EAX_05;
  int iVar4;
  OptionAdder *pOVar5;
  string local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  size_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  element_type *local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_b0;
  shared_ptr<const_cxxopts::Value> local_a8;
  OptionAdder local_98;
  string local_70;
  string local_50;
  
  local_d8 = &local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"");
  uVar3 = local_c8._M_allocated_capacity._0_4_;
  local_98.m_group._M_string_length = local_d0;
  paVar1 = &local_f8.field_2;
  if (local_d8 == &local_c8) {
    local_f8.field_2._8_4_ = local_c8._8_4_;
    local_f8.field_2._12_4_ = local_c8._12_4_;
    local_f8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_f8._M_dataplus._M_p = (pointer)local_d8;
  }
  local_f8.field_2._M_allocated_capacity._4_4_ = local_c8._M_allocated_capacity._4_4_;
  local_f8.field_2._M_allocated_capacity._0_4_ = local_c8._M_allocated_capacity._0_4_;
  local_f8._M_string_length = local_d0;
  local_d0 = 0;
  local_c8._M_allocated_capacity._0_4_ = local_c8._M_allocated_capacity._0_4_ & 0xffffff00;
  paVar2 = &local_98.m_group.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p == paVar1) {
    local_98.m_group.field_2._M_allocated_capacity =
         CONCAT44(local_c8._M_allocated_capacity._4_4_,uVar3);
    local_98.m_group.field_2._8_4_ = local_f8.field_2._8_4_;
    local_98.m_group.field_2._12_4_ = local_f8.field_2._12_4_;
    local_98.m_group._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_98.m_group._M_dataplus._M_p = local_f8._M_dataplus._M_p;
    local_98.m_group.field_2._M_allocated_capacity = local_f8.field_2._M_allocated_capacity;
  }
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  local_d8 = &local_c8;
  local_98.m_options = (Options *)ctx;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"target","");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,
             "Target transcode format. Block compressed transcode targets can only be saved in raw format. Case-insensitive.\nPossible options are: etc-rgb | etc-rgba | eac-r11 | eac-rg11 | bc1 | bc3 | bc4 | bc5 | bc7 | astc | r8 | rg8 | rgb8 | rgba8.\netc-rgb is ETC1; etc-rgba, eac-r11 and eac-rg11 are ETC2."
             ,"");
  cxxopts::value<std::__cxx11::string>();
  local_a8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_b8;
  local_a8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_b0;
  local_b8 = (element_type *)0x0;
  p_Stack_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"<target>","");
  pOVar5 = cxxopts::OptionAdder::operator()(&local_98,&local_f8,&local_50,&local_a8,&local_70);
  iVar4 = (int)pOVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    iVar4 = extraout_EAX;
  }
  if (local_a8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    iVar4 = extraout_EAX_00;
  }
  if (p_Stack_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_b0);
    iVar4 = extraout_EAX_01;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    iVar4 = extraout_EAX_02;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    iVar4 = extraout_EAX_03;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.m_group._M_dataplus._M_p != paVar2) {
    operator_delete(local_98.m_group._M_dataplus._M_p,
                    local_98.m_group.field_2._M_allocated_capacity + 1);
    iVar4 = extraout_EAX_04;
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,CONCAT44(local_c8._M_allocated_capacity._4_4_,
                                      local_c8._M_allocated_capacity._0_4_) + 1);
    iVar4 = extraout_EAX_05;
  }
  return iVar4;
}

Assistant:

void CommandTranscode::OptionsTranscode::init(cxxopts::Options& opts) {
    opts.add_options()
        ("target", "Target transcode format."
                   " Block compressed transcode targets can only be saved in raw format."
                   " Case-insensitive."
                   "\nPossible options are:"
                   " etc-rgb | etc-rgba | eac-r11 | eac-rg11 | bc1 | bc3 | bc4 | bc5 | bc7 | astc |"
                   " r8 | rg8 | rgb8 | rgba8."
                   "\netc-rgb is ETC1; etc-rgba, eac-r11 and eac-rg11 are ETC2.",
                   cxxopts::value<std::string>(), "<target>");
}